

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_interpreter_loadSourceCodeWithSolvedPath(sysbvm_context_t *context,sysbvm_tuple_t filename)

{
  sysbvm_tuple_t sVar1;
  anon_struct_48_6_0f678a37 gcFrame;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_tuple_t local_58;
  sysbvm_tuple_t sStack_50;
  sysbvm_tuple_t local_48;
  sysbvm_tuple_t sStack_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *puStack_20;
  
  puStack_20 = (undefined1 *)&local_68;
  sStack_60 = 0;
  local_48 = 0;
  sStack_40 = 0;
  local_58 = 0;
  sStack_50 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 6;
  local_68 = filename;
  sysbvm_stackFrame_pushRecord(&local_38);
  sStack_60 = sysbvm_io_readWholeFileNamedAsString(context,local_68);
  if (sStack_60 == 0) {
    sVar1 = sysbvm_symbol_internWithCString(context,"Failed to load source file from: ");
    sVar1 = sysbvm_string_concat(context,sVar1,local_68);
    sysbvm_errorWithMessageTuple(sVar1);
  }
  local_58 = sysbvm_filesystem_dirname(context,local_68);
  sStack_50 = sysbvm_filesystem_basename(context,local_68);
  local_48 = sysbvm_sourceCode_inferLanguageFromSourceName(context,sStack_50);
  sStack_40 = sysbvm_sourceCode_create(context,sStack_60,local_58,sStack_50,local_48);
  sysbvm_stackFrame_popRecord(&local_38);
  return sStack_40;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_loadSourceCodeWithSolvedPath(sysbvm_context_t *context, sysbvm_tuple_t filename)
{
    struct {
        sysbvm_tuple_t filename;
        sysbvm_tuple_t sourceString;
        sysbvm_tuple_t sourceDirectory;
        sysbvm_tuple_t sourceName;
        sysbvm_tuple_t sourceLanguage;
        sysbvm_tuple_t sourceCode;
    } gcFrame = {
        .filename = filename,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.sourceString = sysbvm_io_readWholeFileNamedAsString(context, gcFrame.filename);
    if(!gcFrame.sourceString)
        sysbvm_errorWithMessageTuple(sysbvm_string_concat(context,
            sysbvm_symbol_internWithCString(context, "Failed to load source file from: "),
            gcFrame.filename));

    gcFrame.sourceDirectory = sysbvm_filesystem_dirname(context, gcFrame.filename);
    gcFrame.sourceName = sysbvm_filesystem_basename(context, gcFrame.filename);
    gcFrame.sourceLanguage = sysbvm_sourceCode_inferLanguageFromSourceName(context, gcFrame.sourceName);
    gcFrame.sourceCode = sysbvm_sourceCode_create(context, gcFrame.sourceString, gcFrame.sourceDirectory, gcFrame.sourceName, gcFrame.sourceLanguage);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.sourceCode;
}